

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O1

void Fraig_NodeVecPush(Fraig_NodeVec_t *p,Fraig_Node_t *Entry)

{
  int iVar1;
  int nCapMin;
  
  iVar1 = p->nCap;
  if (p->nSize == iVar1) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Fraig_NodeVecGrow(p,nCapMin);
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

void Fraig_NodeVecPush( Fraig_NodeVec_t * p, Fraig_Node_t * Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Fraig_NodeVecGrow( p, 16 );
        else
            Fraig_NodeVecGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}